

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O1

void __thiscall
jhu::thrax::PhraseTests_ExtraPoints_Test::TestBody(PhraseTests_ExtraPoints_Test *this)

{
  bool bVar1;
  optional<jhu::thrax::Span> oVar2;
  char *in_RCX;
  char *pcVar3;
  char *in_R9;
  string_view sv;
  AssertionResult gtest_ar_;
  optional<jhu::thrax::Span> tgt;
  AssertionResult gtest_ar;
  Alignment a;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  _Storage<jhu::thrax::Span,_true> local_50;
  undefined2 local_4c;
  string local_48;
  AssertHelper local_28;
  Alignment local_20;
  
  sv._M_str = in_RCX;
  sv._M_len = (size_t)"0-0 0-4 2-4 3-3";
  readAlignment(&local_20,(thrax *)0xf,sv);
  oVar2 = minimalTargetSpan(&local_20,(Span)0x10000);
  local_50 = oVar2.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
             super__Optional_payload_base<jhu::thrax::Span>._M_payload;
  local_4c = oVar2.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
             super__Optional_payload_base<jhu::thrax::Span>._4_2_;
  local_60.ptr_._0_1_ =
       oVar2.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
       super__Optional_payload_base<jhu::thrax::Span>._M_engaged;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (oVar2.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
      super__Optional_payload_base<jhu::thrax::Span>._M_engaged == false) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_60,(AssertionResult *)"tgt.has_value()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x1a,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                      (char)local_48._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
                      local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_60.ptr_ = local_60.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,short>
              ((internal *)&local_48,"0","tgt->start",(int *)&local_60,(short *)&local_50);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x1b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_60.ptr_ + 8))();
        }
        local_60.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_60.ptr_._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,short>
              ((internal *)&local_48,"5","tgt->end",(int *)&local_60,&local_50._M_value.end);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x1c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_60.ptr_ + 8))();
        }
        local_60.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(PhraseTests, ExtraPoints) {
  auto a = readAlignment("0-0 0-4 2-4 3-3");
  Span src{0, 1};
  auto tgt = minimalTargetSpan(a, src);
  ASSERT_TRUE(tgt.has_value());
  EXPECT_EQ(0, tgt->start);
  EXPECT_EQ(5, tgt->end);
}